

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,value_type_conflict3 index,
          aiMatrix4x4 *node_global_transform,aiNode *nd)

{
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  aiVector3D *paVar5;
  ShapeGeometry *this_00;
  pointer ppaVar6;
  pointer ppaVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  MeshGeometry *pMVar14;
  aiAnimMesh *paVar15;
  aiMesh *paVar16;
  MatIndexArray *pMVar17;
  Skin *pSVar18;
  pointer puVar19;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar20
  ;
  aiVector3D *paVar21;
  ulong *puVar22;
  long lVar23;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar24;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar25;
  aiColor4D *paVar26;
  uint *puVar27;
  mapped_type *pmVar28;
  const_reference ppSVar29;
  const_reference pvVar30;
  const_reference pvVar31;
  uint *puVar32;
  iterator iVar33;
  aiAnimMesh **ppaVar34;
  reference ppaVar35;
  int *piVar36;
  aiFace *paVar37;
  pointer ppBVar38;
  uint i_1;
  ulong uVar39;
  ulong uVar40;
  size_type __n;
  uint i;
  uint uVar41;
  long lVar42;
  FBXConverter *this_01;
  aiFace *paVar43;
  pointer ppBVar44;
  size_t i_2;
  FBXConverter *__n_00;
  uint j;
  uint uVar45;
  long lVar46;
  float fVar47;
  aiVector3t<float> aVar48;
  uint in_cursor;
  aiMesh *local_188;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_180;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_178;
  MeshGeometry *local_170;
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  *local_168;
  BlendShapeChannel *local_160;
  undefined4 local_154;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_150;
  aiAnimMesh *animMesh;
  aiFace *local_140;
  MatIndexArray *local_138;
  uint local_130;
  uint count;
  FBXConverter *local_128;
  pointer local_120;
  pointer local_118;
  uint outIndex;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseMapping;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  aiVector3D normal;
  aiVector3D vertex;
  undefined4 uStack_74;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  translateIndexMap;
  
  paVar16 = SetupEmptyMesh(this,&mesh->super_Geometry,nd);
  pMVar17 = MeshGeometry::GetMaterialIndices(mesh);
  local_178 = MeshGeometry::GetVertices(mesh);
  local_180 = MeshGeometry::GetFaceIndexCounts(mesh);
  uVar45 = 0;
  local_154 = 0;
  local_128 = this;
  if (this->doc->settings->readWeights == true) {
    pSVar18 = Geometry::DeformerSkin(&mesh->super_Geometry);
    local_154 = (undefined4)CONCAT71((int7)((ulong)pSVar18 >> 8),pSVar18 != (Skin *)0x0);
  }
  puVar19 = (local_180->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar41 = 0;
  for (piVar36 = (pMVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      piVar36 !=
      (pMVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish; piVar36 = piVar36 + 1) {
    if (*piVar36 == index) {
      uVar41 = uVar41 + 1;
      uVar45 = uVar45 + *puVar19;
    }
    puVar19 = puVar19 + 1;
  }
  local_170 = mesh;
  local_138 = pMVar17;
  if (uVar41 == 0) {
    __assert_fail("count_faces",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x4ec,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                 );
  }
  if (uVar45 == 0) {
    __assert_fail("count_vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x4ed,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                 );
  }
  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((char)local_154 != '\0') ||
     (pvVar20 = Geometry::GetBlendShapes(&mesh->super_Geometry),
     (pvVar20->
     super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
     )._M_impl.super__Vector_impl_data._M_finish !=
     (pvVar20->
     super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
     )._M_impl.super__Vector_impl_data._M_start)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&reverseMapping,(ulong)uVar45);
  }
  paVar16->mNumVertices = uVar45;
  uVar39 = (ulong)uVar45 * 0xc;
  paVar21 = (aiVector3D *)operator_new__(uVar39);
  uVar39 = uVar39 - 0xc;
  memset(paVar21,0,(uVar39 - uVar39 % 0xc) + 0xc);
  paVar16->mVertices = paVar21;
  paVar16->mNumFaces = uVar41;
  uVar39 = (ulong)uVar41;
  puVar22 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
  pMVar14 = local_170;
  *puVar22 = uVar39;
  local_140 = (aiFace *)(puVar22 + 1);
  paVar37 = local_140;
  do {
    paVar37->mNumIndices = 0;
    paVar37->mIndices = (uint *)0x0;
    paVar37 = paVar37 + 1;
  } while (paVar37 != (aiFace *)(puVar22 + uVar39 * 2 + 1));
  paVar16->mFaces = local_140;
  local_188 = paVar16;
  local_130 = index;
  local_150 = MeshGeometry::GetNormals(local_170);
  uVar39 = 0xffffffffffffffff;
  lVar23 = (long)(local_150->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(local_150->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar23 != 0) {
    paVar3 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    if (lVar23 != (long)paVar4 - (long)paVar3) {
      __assert_fail("normals.size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0x501,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                   );
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = SUB168(SEXT816(lVar23) / SEXT816(0xc),0);
    uVar40 = SUB168(auVar8 * ZEXT816(0xc),0);
    if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
      uVar40 = uVar39;
    }
    paVar21 = (aiVector3D *)operator_new__(uVar40);
    lVar23 = (long)paVar4 - (long)paVar3;
    if (lVar23 != 0) {
      uVar40 = lVar23 - 0xc;
      memset(paVar21,0,(uVar40 - uVar40 % 0xc) + 0xc);
    }
    local_188->mNormals = paVar21;
  }
  local_160 = (BlendShapeChannel *)MeshGeometry::GetTangents(pMVar14);
  local_168 = (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
               *)MeshGeometry::GetBinormals(pMVar14);
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar23 = (long)(local_160->super_Deformer).super_Object.element -
           (long)((_Vector_impl_data *)&(local_160->super_Deformer).super_Object._vptr_Object)->
                 _M_start;
  if (lVar23 != 0) {
    if ((((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
         &local_168->
          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
         )->_M_impl).super__Vector_impl_data._M_finish ==
        (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
         &local_168->
          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
         )->_M_impl).super__Vector_impl_data._M_start) {
      lVar23 = (long)(local_150->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_150->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar23 == 0) {
        local_168 = (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                     *)0x0;
        goto LAB_0015db3b;
      }
      local_168 = (vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                   *)&tempBinormals;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_168,
                 lVar23 / 0xc);
      uVar45 = 0;
      while( true ) {
        uVar40 = (ulong)uVar45;
        paVar3 = ((_Vector_impl_data *)&(local_160->super_Deformer).super_Object._vptr_Object)->
                 _M_start;
        lVar23 = (long)(local_160->super_Deformer).super_Object.element - (long)paVar3;
        if ((ulong)(lVar23 / 0xc) <= uVar40) break;
        aVar48 = operator^((local_150->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar40,paVar3 + uVar40);
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar40].x = (float)(int)aVar48._0_8_;
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar40].y =
             (float)(int)((ulong)aVar48._0_8_ >> 0x20);
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar40].z = aVar48.z;
        uVar45 = uVar45 + 1;
      }
    }
    paVar3 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar42 = (long)paVar4 - (long)paVar3;
    if ((lVar23 != lVar42) ||
       ((long)(((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &local_168->
                super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
               )->_M_impl).super__Vector_impl_data._M_finish -
        (long)(((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &local_168->
                super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
               )->_M_impl).super__Vector_impl_data._M_start != lVar23)) {
      __assert_fail("tangents.size() == vertices.size() && binormals->size() == vertices.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0x51c,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                   );
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(SEXT816(lVar42) / SEXT816(0xc),0);
    uVar40 = SUB168(auVar9 * ZEXT816(0xc),0);
    if (SUB168(auVar9 * ZEXT816(0xc),8) != 0) {
      uVar40 = uVar39;
    }
    paVar21 = (aiVector3D *)operator_new__(uVar40);
    lVar23 = (long)paVar4 - (long)paVar3;
    if (lVar23 != 0) {
      uVar40 = lVar23 - 0xc;
      memset(paVar21,0,(uVar40 - uVar40 % 0xc) + 0xc);
    }
    local_188->mTangents = paVar21;
    paVar3 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(SEXT816((long)paVar4 - (long)paVar3) / SEXT816(0xc),0);
    uVar40 = SUB168(auVar10 * ZEXT816(0xc),0);
    if (SUB168(auVar10 * ZEXT816(0xc),8) != 0) {
      uVar40 = uVar39;
    }
    paVar21 = (aiVector3D *)operator_new__(uVar40);
    lVar23 = (long)paVar4 - (long)paVar3;
    if (lVar23 != 0) {
      uVar40 = lVar23 - 0xc;
      memset(paVar21,0,(uVar40 - uVar40 % 0xc) + 0xc);
    }
    local_188->mBitangents = paVar21;
  }
LAB_0015db3b:
  lVar23 = 0;
  while ((lVar23 != 8 &&
         (pvVar24 = MeshGeometry::GetTextureCoords(local_170,(uint)lVar23),
         (pvVar24->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_start !=
         (pvVar24->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
         _M_impl.super__Vector_impl_data._M_finish))) {
    paVar3 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SUB168(SEXT816((long)paVar4 - (long)paVar3) / SEXT816(0xc),0);
    uVar40 = uVar39;
    if (SUB168(auVar11 * ZEXT816(0xc),8) == 0) {
      uVar40 = SUB168(auVar11 * ZEXT816(0xc),0);
    }
    paVar21 = (aiVector3D *)operator_new__(uVar40);
    lVar42 = (long)paVar4 - (long)paVar3;
    if (lVar42 != 0) {
      uVar40 = lVar42 - 0xc;
      memset(paVar21,0,(uVar40 - uVar40 % 0xc) + 0xc);
    }
    local_188->mTextureCoords[lVar23] = paVar21;
    local_188->mNumUVComponents[lVar23] = 2;
    lVar23 = lVar23 + 1;
  }
  lVar42 = 0;
  while ((lVar42 != 8 &&
         (pvVar25 = MeshGeometry::GetVertexColors(local_170,(uint)lVar42),
         (pvVar25->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
         .super__Vector_impl_data._M_start !=
         (pvVar25->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
         .super__Vector_impl_data._M_finish))) {
    paVar3 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = (local_178->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar39 = ((long)paVar4 - (long)paVar3) / 0xc;
    uVar40 = uVar39 << 4;
    paVar26 = (aiColor4D *)operator_new__(-(ulong)(uVar39 >> 0x3c != 0) | uVar40);
    if (paVar4 != paVar3) {
      memset(paVar26,0,uVar40);
    }
    local_188->mColors[lVar42] = paVar26;
    lVar42 = lVar42 + 1;
  }
  in_cursor = 0;
  puVar32 = (local_180->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppBVar38 = (pointer)(local_138->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
  local_120 = (pointer)(local_138->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
  local_180 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  paVar37 = local_140;
  paVar16 = local_188;
  uVar45 = local_130;
  while (pMVar14 = local_170, ppBVar38 != local_120) {
    uVar41 = *puVar32;
    local_118 = ppBVar38;
    if (*(uint *)ppBVar38 == uVar45) {
      paVar37->mNumIndices = uVar41;
      puVar27 = (uint *)operator_new__((long)(ulong)uVar41 * 4);
      paVar37->mIndices = puVar27;
      uVar45 = 8;
      if (uVar41 - 1 < 3) {
        uVar45 = *(uint *)(&DAT_001d1784 + (ulong)(uVar41 - 1) * 4);
      }
      paVar43 = paVar37 + 1;
      paVar16->mPrimitiveTypes = uVar45 | paVar16->mPrimitiveTypes;
      local_140 = paVar37;
      local_138 = (MatIndexArray *)(ulong)uVar41;
      for (pMVar17 = (MatIndexArray *)0x0; paVar16 = local_188, uVar45 = local_130,
          pMVar17 != local_138;
          pMVar17 = (MatIndexArray *)
                    ((long)&(pMVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + 1)) {
        local_140->mIndices[(long)pMVar17] = (uint)local_180;
        uVar39 = (ulong)local_180 & 0xffffffff;
        if (reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar39] = in_cursor;
          pmVar28 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[](&translateIndexMap,&in_cursor);
          *pmVar28 = (mapped_type)local_180;
        }
        uVar40 = (ulong)in_cursor;
        paVar3 = (local_178->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        paVar21 = local_188->mVertices;
        paVar21[uVar39].z = paVar3[uVar40].z;
        paVar3 = paVar3 + uVar40;
        fVar47 = paVar3->y;
        paVar21 = paVar21 + uVar39;
        paVar21->x = paVar3->x;
        paVar21->y = fVar47;
        paVar21 = local_188->mNormals;
        if (paVar21 != (aiVector3D *)0x0) {
          paVar3 = (local_150->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar21[uVar39].z = paVar3[uVar40].z;
          paVar3 = paVar3 + uVar40;
          fVar47 = paVar3->y;
          paVar21[uVar39].x = paVar3->x;
          paVar21[uVar39].y = fVar47;
        }
        paVar21 = local_188->mTangents;
        if (paVar21 != (aiVector3D *)0x0) {
          paVar3 = ((_Vector_impl_data *)&(local_160->super_Deformer).super_Object._vptr_Object)->
                   _M_start;
          paVar21[uVar39].z = paVar3[uVar40].z;
          paVar3 = paVar3 + uVar40;
          fVar47 = paVar3->y;
          paVar21[uVar39].x = paVar3->x;
          paVar21[uVar39].y = fVar47;
          paVar3 = (((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    &local_168->
                     super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                    )->_M_impl).super__Vector_impl_data._M_start;
          paVar21 = local_188->mBitangents;
          paVar21[uVar39].z = paVar3[uVar40].z;
          paVar3 = paVar3 + uVar40;
          fVar47 = paVar3->y;
          paVar21 = paVar21 + uVar39;
          paVar21->x = paVar3->x;
          paVar21->y = fVar47;
        }
        for (lVar46 = 0; lVar23 != lVar46; lVar46 = lVar46 + 1) {
          pvVar24 = MeshGeometry::GetTextureCoords(local_170,(uint)lVar46);
          paVar5 = local_188->mTextureCoords[lVar46];
          paVar1 = (pvVar24->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start + in_cursor;
          fVar47 = paVar1->y;
          paVar21 = paVar5 + uVar39;
          paVar21->x = paVar1->x;
          paVar21->y = fVar47;
          paVar5[uVar39].z = 0.0;
        }
        for (lVar46 = 0; lVar42 != lVar46; lVar46 = lVar46 + 1) {
          pvVar25 = MeshGeometry::GetVertexColors(local_170,(uint)lVar46);
          paVar2 = (pvVar25->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_start + in_cursor;
          fVar47 = paVar2->g;
          fVar12 = paVar2->b;
          fVar13 = paVar2->a;
          paVar26 = local_188->mColors[lVar46] + uVar39;
          paVar26->r = paVar2->r;
          paVar26->g = fVar47;
          paVar26->b = fVar12;
          paVar26->a = fVar13;
        }
        local_180 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    (ulong)((int)local_180 + 1);
        in_cursor = in_cursor + 1;
      }
    }
    else {
      in_cursor = in_cursor + uVar41;
      paVar43 = paVar37;
    }
    puVar32 = puVar32 + 1;
    paVar37 = paVar43;
    ppBVar38 = (pointer)((long)local_118 + 4);
  }
  ConvertMaterialForMesh(local_128,paVar16,model,local_170,uVar45);
  if ((char)local_154 != '\0') {
    ConvertWeights(local_128,paVar16,model,pMVar14,node_global_transform,uVar45,&reverseMapping);
  }
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar20 = Geometry::GetBlendShapes(&pMVar14->super_Geometry);
  pMVar17 = (MatIndexArray *)
            (pvVar20->
            super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  ppBVar38 = (pointer)(pvVar20->
                      super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
  local_138 = pMVar17;
  while (paVar16 = local_188, (MatIndexArray *)ppBVar38 != pMVar17) {
    local_118 = (pointer)((*ppBVar38)->fullWeights).
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
    local_120 = ppBVar38;
    for (ppBVar44 = (((vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                       *)&(*ppBVar38)->percent)->
                    super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppBVar44 != local_118;
        ppBVar44 = ppBVar44 + 1) {
      local_160 = *ppBVar44;
      local_168 = &local_160->shapeGeometries;
      for (__n_00 = (FBXConverter *)0x0;
          __n_00 < (FBXConverter *)
                   ((long)(local_160->shapeGeometries).
                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_160->shapeGeometries).
                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n_00 = (FBXConverter *)((long)&__n_00->defaultMaterialIndex + 1)) {
        animMesh = aiCreateAnimMesh(local_188);
        this_01 = __n_00;
        ppSVar29 = std::
                   vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                   ::at(local_168,(size_type)__n_00);
        this_00 = *ppSVar29;
        local_140 = (aiFace *)ShapeGeometry::GetVertices(this_00);
        local_150 = ShapeGeometry::GetNormals(this_00);
        local_178 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    ShapeGeometry::GetIndices(this_00);
        paVar15 = animMesh;
        FixAnimMeshName((string *)&vertex,this_01,&(this_00->super_Geometry).super_Object.name);
        uVar39 = CONCAT44(uStack_74,vertex.z);
        if (uVar39 < 0x400) {
          (paVar15->mName).length = (ai_uint32)vertex.z;
          memcpy((paVar15->mName).data,(void *)vertex._0_8_,uVar39);
          (paVar15->mName).data[uVar39] = '\0';
        }
        std::__cxx11::string::~string((string *)&vertex);
        uVar39 = 0;
        while (pMVar17 = local_138,
              uVar39 < (ulong)((long)(local_178->
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_178->
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 2)) {
          pvVar30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_178,
                               uVar39);
          uVar45 = *pvVar30;
          pvVar31 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_140,uVar39);
          vertex.z = pvVar31->z;
          vertex.x = pvVar31->x;
          vertex.y = pvVar31->y;
          pvVar31 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                              (local_150,uVar39);
          normal.z = pvVar31->z;
          normal.x = pvVar31->x;
          normal.y = pvVar31->y;
          count = 0;
          puVar32 = MeshGeometry::ToOutputVertexIndex(local_170,uVar45,&count);
          local_180 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)uVar39;
          for (uVar40 = 0; uVar40 < count; uVar40 = uVar40 + 1) {
            outIndex = puVar32[uVar40];
            iVar33 = std::
                     _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::find(&translateIndexMap._M_t,&outIndex);
            if ((_Rb_tree_header *)iVar33._M_node !=
                &translateIndexMap._M_t._M_impl.super__Rb_tree_header) {
              pmVar28 = std::
                        map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        ::operator[](&translateIndexMap,&outIndex);
              uVar45 = *pmVar28;
              aiVector3t<float>::operator+=(animMesh->mVertices + uVar45,&vertex);
              if (animMesh->mNormals != (aiVector3D *)0x0) {
                aiVector3t<float>::operator+=(animMesh->mNormals + uVar45,&normal);
                aiVector3t<float>::NormalizeSafe(animMesh->mNormals + uVar45);
              }
            }
          }
          uVar39 = (long)local_180 + 1;
        }
        fVar47 = 1.0;
        if (8 < (ulong)((long)(local_160->shapeGeometries).
                              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_160->shapeGeometries).
                             super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          fVar47 = local_160->percent / 100.0;
        }
        animMesh->mWeight = fVar47;
        std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::push_back(&animMeshes,&animMesh);
      }
    }
    ppBVar38 = local_120 + 1;
  }
  if ((long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar39 = (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    local_188->mNumAnimMeshes = (uint)uVar39;
    ppaVar34 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar39 >> 0x3d != 0) |
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    paVar16->mAnimMeshes = ppaVar34;
    for (__n = 0; uVar39 != __n; __n = __n + 1) {
      ppaVar35 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::at(&animMeshes,__n);
      paVar16->mAnimMeshes[__n] = *ppaVar35;
    }
  }
  ppaVar6 = (local_128->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar7 = (local_128->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::_Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::~_Vector_base
            (&animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&translateIndexMap._M_t);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return (int)((ulong)((long)ppaVar6 - (long)ppaVar7) >> 3) - 1;
}

Assistant:

unsigned int FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry& mesh, const Model& model,
            MatIndexArray::value_type index,
            const aiMatrix4x4& node_global_transform,
            aiNode& nd)
        {
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, nd);

            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            const bool process_weights = doc.Settings().readWeights && mesh.DeformerSkin() != NULL;

            unsigned int count_faces = 0;
            unsigned int count_vertices = 0;

            // count faces
            std::vector<unsigned int>::const_iterator itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(),
                end = mindices.end(); it != end; ++it, ++itf)
            {
                if ((*it) != index) {
                    continue;
                }
                ++count_faces;
                count_vertices += *itf;
            }

            ai_assert(count_faces);
            ai_assert(count_vertices);

            // mapping from output indices to DOM indexing, needed to resolve weights or blendshapes
            std::vector<unsigned int> reverseMapping;
            std::map<unsigned int, unsigned int> translateIndexMap;
            if (process_weights || mesh.GetBlendShapes().size() > 0) {
                reverseMapping.resize(count_vertices);
            }

            // allocate output data arrays, but don't fill them yet
            out_mesh->mNumVertices = count_vertices;
            out_mesh->mVertices = new aiVector3D[count_vertices];

            out_mesh->mNumFaces = count_faces;
            aiFace* fac = out_mesh->mFaces = new aiFace[count_faces]();


            // allocate normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());
                out_mesh->mNormals = new aiVector3D[vertices.size()];
            }

            // allocate tangents, binormals.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();
            std::vector<aiVector3D> tempBinormals;

            if (tangents.size()) {
                if (!binormals->size()) {
                    if (normals.size()) {
                        // XXX this computes the binormals for the entire mesh, not only
                        // the part for which we need them.
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = NULL;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size() && binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                }
            }

            // allocate texture coords
            unsigned int num_uvs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i, ++num_uvs) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                out_mesh->mNumUVComponents[i] = 2;
            }

            // allocate vertex colors
            unsigned int num_vcs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i, ++num_vcs) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
            }

            unsigned int cursor = 0, in_cursor = 0;

            itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(), end = mindices.end(); it != end; ++it, ++itf)
            {
                const unsigned int pcount = *itf;
                if ((*it) != index) {
                    in_cursor += pcount;
                    continue;
                }

                aiFace& f = *fac++;

                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i, ++cursor, ++in_cursor) {
                    f.mIndices[i] = cursor;

                    if (reverseMapping.size()) {
                        reverseMapping[cursor] = in_cursor;
                        translateIndexMap[in_cursor] = cursor;
                    }

                    out_mesh->mVertices[cursor] = vertices[in_cursor];

                    if (out_mesh->mNormals) {
                        out_mesh->mNormals[cursor] = normals[in_cursor];
                    }

                    if (out_mesh->mTangents) {
                        out_mesh->mTangents[cursor] = tangents[in_cursor];
                        out_mesh->mBitangents[cursor] = (*binormals)[in_cursor];
                    }

                    for (unsigned int j = 0; j < num_uvs; ++j) {
                        const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(j);
                        out_mesh->mTextureCoords[j][cursor] = aiVector3D(uvs[in_cursor].x, uvs[in_cursor].y, 0.0f);
                    }

                    for (unsigned int j = 0; j < num_vcs; ++j) {
                        const std::vector<aiColor4D>& cols = mesh.GetVertexColors(j);
                        out_mesh->mColors[j][cursor] = cols[in_cursor];
                    }
                }
            }

            ConvertMaterialForMesh(out_mesh, model, mesh, index);

            if (process_weights) {
                ConvertWeights(out_mesh, model, mesh, node_global_transform, index, &reverseMapping);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh* animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int outIndex = outIndices[k];
                                if (translateIndexMap.find(outIndex) == translateIndexMap.end())
                                    continue;
                                unsigned int index = translateIndexMap[outIndex];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }

            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }

            return static_cast<unsigned int>(meshes.size() - 1);
        }